

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O2

ElementsDecodeRawTransactionResponseStruct * __thiscall
cfd::js::api::
ExecuteStructApi<cfd::js::api::ElementsDecodeRawTransactionRequestStruct,cfd::js::api::ElementsDecodeRawTransactionResponseStruct>
          (ElementsDecodeRawTransactionResponseStruct *__return_storage_ptr__,api *this,
          ElementsDecodeRawTransactionRequestStruct *request,
          function<cfd::js::api::ElementsDecodeRawTransactionResponseStruct_(const_cfd::js::api::ElementsDecodeRawTransactionRequestStruct_&)>
          *call_function,string *fuction_name)

{
  ElementsDecodeRawTransactionResponseStruct local_198;
  
  ElementsDecodeRawTransactionResponseStruct::ElementsDecodeRawTransactionResponseStruct
            (__return_storage_ptr__);
  cfd::Initialize();
  std::
  function<cfd::js::api::ElementsDecodeRawTransactionResponseStruct_(const_cfd::js::api::ElementsDecodeRawTransactionRequestStruct_&)>
  ::operator()(&local_198,
               (function<cfd::js::api::ElementsDecodeRawTransactionResponseStruct_(const_cfd::js::api::ElementsDecodeRawTransactionRequestStruct_&)>
                *)request,(ElementsDecodeRawTransactionRequestStruct *)this);
  ElementsDecodeRawTransactionResponseStruct::operator=(__return_storage_ptr__,&local_198);
  ElementsDecodeRawTransactionResponseStruct::~ElementsDecodeRawTransactionResponseStruct
            (&local_198);
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteStructApi(
    const RequestStructType& request,
    std::function<ResponseStructType(const RequestStructType&)> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function(request);
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}